

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbcursor.cpp
# Opt level: O1

xcb_cursor_t __thiscall QXcbCursor::createNonStandardCursor(QXcbCursor *this,int cshape)

{
  xcb_window_t xVar1;
  xcb_connection_t *pxVar2;
  undefined *puVar3;
  QXcbScreen *screen;
  char cVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  xcb_cursor_t xVar7;
  xcb_pixmap_t xVar8;
  xcb_pixmap_t xVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  long in_FS_OFFSET;
  long lVar12;
  QPixmap local_70 [24];
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pxVar2 = (((this->super_QXcbObject).m_connection)->super_QXcbBasicConnection).m_xcbConnection;
  if (cshape == 10) {
    xVar1 = this->m_screen->m_virtualDesktop->m_screen->root;
    puVar11 = cur_blank_bits;
    puVar10 = cur_blank_bits;
LAB_00158c00:
    uVar5 = xcb_create_pixmap_from_bitmap_data(pxVar2,xVar1,puVar10,0x10,0x10,1,0,0,0);
    uVar6 = xcb_create_pixmap_from_bitmap_data
                      (pxVar2,this->m_screen->m_virtualDesktop->m_screen->root,puVar11,0x10,0x10,1,0
                       ,0,0);
    xVar7 = xcb_generate_id(pxVar2);
    lVar12 = 8;
  }
  else {
    if (cshape - 5U < 4) {
      xVar1 = this->m_screen->m_virtualDesktop->m_screen->root;
      puVar10 = (&PTR_customEvent_001b5360)[(uint)(cshape * 2)];
      puVar11 = (&PTR_connectNotify_001b5368)[(uint)(cshape * 2)];
      goto LAB_00158c00;
    }
    if (0x10 < (uint)cshape) {
LAB_00158e70:
      if (1 < cshape - 0x11U) {
        xVar7 = 0;
        if (cshape - 0x13U < 3) {
          local_48 = &DAT_aaaaaaaaaaaaaaaa;
          local_58 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
          QGuiApplicationPrivate::getPixmapCursor((CursorShape)local_70);
          QPixmap::toImage();
          QPixmap::~QPixmap(local_70);
          cVar4 = QImage::isNull();
          xVar7 = 0;
          if (cVar4 == '\0') {
            xVar8 = qt_xcb_XPixmapFromBitmap(this->m_screen,(QImage *)&local_58);
            screen = this->m_screen;
            QImage::createAlphaMask((QImage *)local_70,(QImage *)&local_58,0);
            xVar9 = qt_xcb_XPixmapFromBitmap(screen,(QImage *)local_70);
            QImage::~QImage((QImage *)local_70);
            xVar7 = xcb_generate_id(pxVar2);
            xcb_create_cursor(pxVar2,xVar7,xVar8,xVar9,0,0,0,0xffff,0xffff,0xffff,8,8);
            xcb_free_pixmap(pxVar2,xVar8);
            xcb_free_pixmap(pxVar2,xVar9);
          }
          QImage::~QImage((QImage *)&local_58);
        }
        goto LAB_00158d8d;
      }
      xVar1 = this->m_screen->m_virtualDesktop->m_screen->root;
      puVar10 = "";
      if (cshape == 0x11) {
        puVar10 = openhand_bits;
      }
      puVar11 = "";
      if (cshape == 0x11) {
        puVar11 = openhandm_bits;
      }
      goto LAB_00158c00;
    }
    if ((0x19800U >> (cshape & 0x1fU) & 1) == 0) {
      if (cshape != 0xe) goto LAB_00158e70;
      uVar5 = xcb_create_pixmap_from_bitmap_data
                        (pxVar2,this->m_screen->m_virtualDesktop->m_screen->root,"",0x14,0x14,1,0,0,
                         0);
      uVar6 = xcb_create_pixmap_from_bitmap_data
                        (pxVar2,this->m_screen->m_virtualDesktop->m_screen->root,forbiddenm_bits,
                         0x14,0x14,1,0,0,0);
      xVar7 = xcb_generate_id(pxVar2);
      lVar12 = 10;
    }
    else {
      puVar3 = (&PTR_connectNotify_001b5368)[(uint)(cshape * 2)];
      uVar5 = xcb_create_pixmap_from_bitmap_data
                        (pxVar2,this->m_screen->m_virtualDesktop->m_screen->root,
                         (&PTR_customEvent_001b5360)[(uint)(cshape * 2)],0x20,0x20,1,0,0,0);
      uVar6 = xcb_create_pixmap_from_bitmap_data
                        (pxVar2,this->m_screen->m_virtualDesktop->m_screen->root,puVar3,0x20,0x20,1,
                         0,0,0);
      xVar7 = xcb_generate_id(pxVar2);
      lVar12 = (ulong)((cshape & 0x1dU) != 0xd) << 4;
      if (cshape == 0x10) {
        lVar12 = 0;
      }
    }
  }
  xcb_create_cursor(pxVar2,xVar7,uVar5,uVar6,0,0,0,0xffff,0xffff,0xffff,lVar12,lVar12);
LAB_00158d8d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return xVar7;
}

Assistant:

xcb_cursor_t QXcbCursor::createNonStandardCursor(int cshape)
{
    xcb_cursor_t cursor = 0;
    xcb_connection_t *conn = xcb_connection();

    if (cshape == Qt::BlankCursor) {
        xcb_pixmap_t cp = xcb_create_pixmap_from_bitmap_data(conn, m_screen->root(), cur_blank_bits, 16, 16,
                                                             1, 0, 0, nullptr);
        xcb_pixmap_t mp = xcb_create_pixmap_from_bitmap_data(conn, m_screen->root(), cur_blank_bits, 16, 16,
                                                             1, 0, 0, nullptr);
        cursor = xcb_generate_id(conn);
        xcb_create_cursor(conn, cursor, cp, mp, 0, 0, 0, 0xFFFF, 0xFFFF, 0xFFFF, 8, 8);
    } else if (cshape >= Qt::SizeVerCursor && cshape < Qt::SizeAllCursor) {
        int i = (cshape - Qt::SizeVerCursor) * 2;
        xcb_pixmap_t pm = xcb_create_pixmap_from_bitmap_data(conn, m_screen->root(),
                                                             const_cast<uint8_t*>(cursor_bits16[i]),
                                                             16, 16, 1, 0, 0, nullptr);
        xcb_pixmap_t pmm = xcb_create_pixmap_from_bitmap_data(conn, m_screen->root(),
                                                              const_cast<uint8_t*>(cursor_bits16[i + 1]),
                                                              16, 16, 1, 0, 0, nullptr);
        cursor = xcb_generate_id(conn);
        xcb_create_cursor(conn, cursor, pm, pmm, 0, 0, 0, 0xFFFF, 0xFFFF, 0xFFFF, 8, 8);
    } else if ((cshape >= Qt::SplitVCursor && cshape <= Qt::SplitHCursor)
               || cshape == Qt::WhatsThisCursor || cshape == Qt::BusyCursor) {
        int i = (cshape - Qt::SplitVCursor) * 2;
        xcb_pixmap_t pm = xcb_create_pixmap_from_bitmap_data(conn, m_screen->root(),
                                                             const_cast<uint8_t*>(cursor_bits32[i]),
                                                             32, 32, 1, 0, 0, nullptr);
        xcb_pixmap_t pmm = xcb_create_pixmap_from_bitmap_data(conn, m_screen->root(),
                                                              const_cast<uint8_t*>(cursor_bits32[i + 1]),
                                                              32, 32, 1, 0, 0, nullptr);
        int hs = (cshape == Qt::PointingHandCursor || cshape == Qt::WhatsThisCursor
                  || cshape == Qt::BusyCursor) ? 0 : 16;
        cursor = xcb_generate_id(conn);
        xcb_create_cursor(conn, cursor, pm, pmm, 0, 0, 0, 0xFFFF, 0xFFFF, 0xFFFF, hs, hs);
    } else if (cshape == Qt::ForbiddenCursor) {
        int i = (cshape - Qt::ForbiddenCursor) * 2;
        xcb_pixmap_t pm = xcb_create_pixmap_from_bitmap_data(conn, m_screen->root(),
                                                             const_cast<uint8_t*>(cursor_bits20[i]),
                                                             20, 20, 1, 0, 0, nullptr);
        xcb_pixmap_t pmm = xcb_create_pixmap_from_bitmap_data(conn, m_screen->root(),
                                                              const_cast<uint8_t*>(cursor_bits20[i + 1]),
                                                              20, 20, 1, 0, 0, nullptr);
        cursor = xcb_generate_id(conn);
        xcb_create_cursor(conn, cursor, pm, pmm, 0, 0, 0, 0xFFFF, 0xFFFF, 0xFFFF, 10, 10);
    } else if (cshape == Qt::OpenHandCursor || cshape == Qt::ClosedHandCursor) {
        bool open = cshape == Qt::OpenHandCursor;
        xcb_pixmap_t pm = xcb_create_pixmap_from_bitmap_data(conn, m_screen->root(),
                                                             const_cast<uint8_t*>(open ? openhand_bits : closedhand_bits),
                                                             16, 16, 1, 0, 0, nullptr);
        xcb_pixmap_t pmm = xcb_create_pixmap_from_bitmap_data(conn, m_screen->root(),
                                                             const_cast<uint8_t*>(open ? openhandm_bits : closedhandm_bits),
                                                             16, 16, 1, 0, 0, nullptr);
        cursor = xcb_generate_id(conn);
        xcb_create_cursor(conn, cursor, pm, pmm, 0, 0, 0, 0xFFFF, 0xFFFF, 0xFFFF, 8, 8);
    } else if (cshape == Qt::DragCopyCursor || cshape == Qt::DragMoveCursor
               || cshape == Qt::DragLinkCursor) {
        QImage image = QGuiApplicationPrivate::instance()->getPixmapCursor(static_cast<Qt::CursorShape>(cshape)).toImage();
        if (!image.isNull()) {
            xcb_pixmap_t pm = qt_xcb_XPixmapFromBitmap(m_screen, image);
            xcb_pixmap_t pmm = qt_xcb_XPixmapFromBitmap(m_screen, image.createAlphaMask());
            cursor = xcb_generate_id(conn);
            xcb_create_cursor(conn, cursor, pm, pmm, 0, 0, 0, 0xFFFF, 0xFFFF, 0xFFFF, 8, 8);
            xcb_free_pixmap(conn, pm);
            xcb_free_pixmap(conn, pmm);
        }
    }

    return cursor;
}